

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O3

void __thiscall GameEngine::generateMap(GameEngine *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Map *pMVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  RandomGenerator *pRVar3;
  Config *pCVar4;
  pair<int,_int> pVar5;
  int32_t width;
  int32_t height;
  undefined1 local_31;
  int32_t local_30;
  int32_t local_2c;
  Map *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  pRVar3 = RandomGenerator::getInstance();
  pCVar4 = Config::getInstance();
  pVar5 = Config::getHeight(pCVar4);
  local_2c = RandomGenerator::randNormalInt(pRVar3,pVar5);
  pRVar3 = RandomGenerator::getInstance();
  pCVar4 = Config::getInstance();
  pVar5 = Config::getWidth(pCVar4);
  local_30 = RandomGenerator::randNormalInt(pRVar3,pVar5);
  local_28 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Map,std::allocator<Map>,int&,int&>
            (&_Stack_20,&local_28,(allocator<Map> *)&local_31,&local_2c,&local_30);
  _Var2._M_pi = _Stack_20._M_pi;
  pMVar1 = local_28;
  local_28 = (Map *)0x0;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pMVar1;
  (this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
    }
  }
  Map::generate((this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  return;
}

Assistant:

void GameEngine::generateMap() {
  int32_t height = RandomGenerator::getInstance().randNormalInt(Config::getInstance().getHeight());
  int32_t width = RandomGenerator::getInstance().randNormalInt(Config::getInstance().getWidth());

  map = std::make_shared<Map>(height, width);
  map->generate();
}